

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CJumpConditionalStatement *statement)

{
  initializer_list<const_IRT::INode_*> __l;
  int id;
  mapped_type *pmVar1;
  allocator local_181;
  string local_180 [32];
  ChildrenAnswers local_160;
  string local_130 [39];
  TLogicOperator local_109;
  string local_108 [32];
  undefined1 local_e8 [8];
  string operationDescription;
  undefined1 local_c0 [4];
  int operationId;
  undefined1 local_a8 [8];
  ChildrenAnswers answers;
  allocator<const_IRT::INode_*> local_61;
  INode *local_60;
  CExpression *local_58;
  CLabelStatement *local_50;
  CLabelStatement *local_48;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  CJumpConditionalStatement *statement_local;
  PrintVisitor *this_local;
  
  children.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)statement;
  local_60 = (INode *)CJumpConditionalStatement::LeftOperand(statement);
  local_58 = CJumpConditionalStatement::RightOperand
                       ((CJumpConditionalStatement *)
                        children.
                        super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_50 = CJumpConditionalStatement::TrueLabel
                       ((CJumpConditionalStatement *)
                        children.
                        super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_48 = CJumpConditionalStatement::FalseLabel
                       ((CJumpConditionalStatement *)
                        children.
                        super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_40 = &local_60;
  local_38 = 4;
  std::allocator<const_IRT::INode_*>::allocator(&local_61);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30,__l,
             &local_61);
  std::allocator<const_IRT::INode_*>::~allocator(&local_61);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_c0,
             (vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_a8,this,
                (vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_c0);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_c0);
  id = this->lastVisited + 1;
  this->lastVisited = id;
  local_109 = CJumpConditionalStatement::Operation
                        ((CJumpConditionalStatement *)
                         children.
                         super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pmVar1 = std::
           map<IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IRT::enums::TLogicOperator>,_std::allocator<std::pair<const_IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IRT::enums::TLogicOperator>,_std::allocator<std::pair<const_IRT::enums::TLogicOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)maps::logicOperationToString_abi_cxx11_,&local_109);
  std::__cxx11::string::string(local_108,(string *)pmVar1);
  ConstructLabel((PrintVisitor *)local_e8,(string *)this,(int)local_108);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::string(local_130,(string *)local_e8);
  ChildrenAnswers::PushBack((ChildrenAnswers *)local_a8,(string *)local_130,id);
  std::__cxx11::string::~string(local_130);
  ChildrenAnswers::ChildrenAnswers(&local_160,(ChildrenAnswers *)local_a8);
  AddChildrenAnswers(this,&local_160);
  ChildrenAnswers::~ChildrenAnswers(&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"ConditionalJump",&local_181);
  AddLabel(this,(string *)local_180);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  this->lastVisited = this->lastVisited + 1;
  std::__cxx11::string::~string((string *)local_e8);
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_a8);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CJumpConditionalStatement &statement ) {
    std::vector<const IRT::INode *> children = { statement.LeftOperand( ), statement.RightOperand( ),
                                                 statement.TrueLabel( ), statement.FalseLabel( ) };
    ChildrenAnswers answers = VisitChildren( children );

    int operationId = ++lastVisited;
    std::string operationDescription = ConstructLabel( IRT::maps::logicOperationToString.at( statement.Operation( )),
                                                       operationId );
    answers.PushBack( operationDescription, operationId );

    AddChildrenAnswers( answers );
    AddLabel( "ConditionalJump" );
    ++lastVisited;
}